

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O2

void __thiscall
arangodb::velocypack::ObjectIterator::ObjectIterator
          (ObjectIterator *this,Slice slice,bool useSequentialIteration)

{
  ValueLength VVar1;
  uint8_t *puVar2;
  Exception *this_00;
  Slice slice_local;
  
  (this->_slice)._start = slice._start;
  this->_current = (uint8_t *)0x0;
  this->_size = 0;
  this->_position = 0;
  slice_local = slice;
  if (SliceStaticData::TypeMap[*slice._start] == Object) {
    VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::objectLength
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &slice_local);
    this->_size = VVar1;
    puVar2 = first(this,useSequentialIteration);
    this->_current = puVar2;
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,InvalidValueType,"Expecting Object slice");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

explicit ObjectIterator(Slice slice, bool useSequentialIteration = false)
      : _slice{slice}, _current{nullptr}, _size{0}, _position{0} {
    auto const head = slice.head();
    if (VELOCYPACK_UNLIKELY(slice.type(head) != ValueType::Object)) {
      throw Exception{Exception::InvalidValueType, "Expecting Object slice"};
    }
    _size = slice.objectLength();
    _current = first(useSequentialIteration);
  }